

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_event.h
# Opt level: O0

void __thiscall
miniros::MessageEvent<const_void>::operator=
          (MessageEvent<const_void> *this,MessageEvent<const_void> *rhs)

{
  MessageEvent<const_void> *in_RSI;
  MessageEvent<const_void> *in_RDI;
  ConstMessagePtr msg;
  MessageEvent<const_void> *in_stack_ffffffffffffff88;
  shared_ptr<const_void> *in_stack_ffffffffffffff98;
  EVP_PKEY_CTX local_20 [16];
  MessageEvent<const_void> *local_10;
  
  local_10 = in_RSI;
  getMessage(in_stack_ffffffffffffff88);
  std::static_pointer_cast<void_const,void_const>(in_stack_ffffffffffffff98);
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)0x4e6955);
  MessageEvent<void_const>::getConnectionHeaderPtr_abi_cxx11_((MessageEvent<void_const> *)local_10);
  getReceiptTime(local_10);
  nonConstWillCopy(local_10);
  getMessageFactory(local_10);
  init(in_RDI,local_20);
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)0x4e69e4);
  return;
}

Assistant:

void operator=(const MessageEvent<ConstMessage>& rhs)
  {
    ConstMessagePtr msg = std::static_pointer_cast<ConstMessage>(rhs.getMessage());
    init(msg,
      rhs.getConnectionHeaderPtr(),
      rhs.getReceiptTime(), rhs.nonConstWillCopy(), rhs.getMessageFactory());
    message_copy_.reset();
  }